

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

char * __thiscall
el::base::utils::CommandLineArgs::getParamValue(CommandLineArgs *this,char *paramKey)

{
  const_iterator cVar1;
  char *pcVar2;
  allocator<char> local_39;
  key_type local_38;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,paramKey,&local_39);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_paramsWithValue)._M_t,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->m_paramsWithValue)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)(cVar1._M_node + 2);
  }
  return pcVar2;
}

Assistant:

const char* CommandLineArgs::getParamValue(const char* paramKey) const {
  std::map<std::string, std::string>::const_iterator iter = m_paramsWithValue.find(std::string(paramKey));
  return iter != m_paramsWithValue.end() ? iter->second.c_str() : "";
}